

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O2

void PDHG_PrintHugeCUPDHG(void)

{
  putchar(10);
  puts("  ____ _   _ ____  ____  _     ____");
  puts(" / ___| | | |  _ \\|  _ \\| |   |  _ \\");
  puts("| |   | | | | |_) | | | | |   | |_) |");
  puts("| |___| |_| |  __/| |_| | |___|  __/");
  puts(" \\____|\\___/|_|   |____/|_____|_|");
  putchar(10);
  return;
}

Assistant:

void PDHG_PrintHugeCUPDHG(void) {
  cupdlp_printf("\n");
  cupdlp_printf("  ____ _   _ ____  ____  _     ____\n");
  cupdlp_printf(" / ___| | | |  _ \\|  _ \\| |   |  _ \\\n");
  cupdlp_printf("| |   | | | | |_) | | | | |   | |_) |\n");
  cupdlp_printf("| |___| |_| |  __/| |_| | |___|  __/\n");
  cupdlp_printf(" \\____|\\___/|_|   |____/|_____|_|\n");
  cupdlp_printf("\n");
}